

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[15],unsigned_int,char[19],unsigned_int,char[47],unsigned_int,char[3]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [15],uint *RestArgs,char (*RestArgs_1) [19],uint *RestArgs_2,
               char (*RestArgs_3) [47],uint *RestArgs_4,char (*RestArgs_5) [3])

{
  char (*RestArgs_local_3) [47];
  uint *RestArgs_local_2;
  char (*RestArgs_local_1) [19];
  uint *RestArgs_local;
  char (*FirstArg_local) [15];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[15]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[19],unsigned_int,char[47],unsigned_int,char[3]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}